

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::registerFederate(Federate *this,FederateInfo *fedInfo)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  Core *coreObj;
  bool bVar3;
  int iVar4;
  pointer __p;
  size_type sVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer __p_00;
  ConnectorFederateManager *this_00;
  byte bVar6;
  pointer __p_1;
  __uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  local_30;
  
  peVar2 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar4 = (*peVar2->_vptr_Core[0x16])
                    (peVar2,(this->mName)._M_string_length,(this->mName)._M_dataplus._M_p,fedInfo);
  (this->fedID).fid = iVar4;
  sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->mName,"${",0,2);
  if (sVar5 != 0xffffffffffffffff) {
    peVar2 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar4 = (*peVar2->_vptr_Core[0x17])(peVar2,(ulong)(uint)(this->fedID).fid);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var,iVar4));
  }
  this->nameSegmentSeparator = fedInfo->separator;
  bVar3 = FederateInfo::checkFlagProperty(fedInfo,0x4b,true);
  this->strictConfigChecking = bVar3;
  this->useJsonSerialization = fedInfo->useJsonSerialization;
  this->observerMode = fedInfo->observer;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->configFile,
             &fedInfo->configString);
  peVar2 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar4 = (*peVar2->_vptr_Core[0x21])(peVar2,(ulong)(uint)(this->fedID).fid);
  (this->mCurrentTime).internalTimeCode = CONCAT44(extraout_var_00,iVar4);
  bVar6 = 1;
  if (this->singleThreadFederate == false) {
    __p_00 = (pointer)operator_new(0xe0);
    p_Var1 = &(__p_00->m_obj).inFlightQueries._M_t._M_impl.super__Rb_tree_header;
    (__p_00->m_obj).initFuture.super___basic_future<bool>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__p_00->m_obj).initFuture.super___basic_future<bool>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__p_00->m_obj).execFuture.super___basic_future<helics::iteration_time>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__p_00->m_obj).execFuture.super___basic_future<helics::iteration_time>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__p_00->m_obj).timeRequestFuture.
    super___basic_future<TimeRepresentation<count_time<9,_long>_>_>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__p_00->m_obj).timeRequestFuture.
    super___basic_future<TimeRepresentation<count_time<9,_long>_>_>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__p_00->m_obj).timeRequestIterativeFuture.super___basic_future<helics::iteration_time>._M_state
    .super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__p_00->m_obj).timeRequestIterativeFuture.super___basic_future<helics::iteration_time>._M_state
    .super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__p_00->m_obj).finalizeFuture.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__p_00->m_obj).finalizeFuture.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__p_00->m_obj).initIterativeFuture.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__p_00->m_obj).initIterativeFuture.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&(__p_00->m_obj).queryCounter = 0;
    *(undefined8 *)&(__p_00->m_obj).inFlightQueries._M_t._M_impl = 0;
    *(undefined8 *)&(__p_00->m_obj).inFlightQueries._M_t._M_impl.super__Rb_tree_header._M_header = 0
    ;
    (__p_00->m_obj).inFlightQueries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__p_00->m_obj).inFlightQueries._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__p_00->m_obj).inFlightQueries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__p_00->m_obj).inFlightQueries._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(__p_00->m_obj).asyncCheck.super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__p_00->m_obj).asyncCheck.super__Function_base._M_functor + 8) = 0;
    (__p_00->m_obj).asyncCheck.super__Function_base._M_manager = (_Manager_type)0x0;
    (__p_00->m_obj).asyncCheck._M_invoker = (_Invoker_type)0x0;
    (__p_00->m_mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(__p_00->m_mutex).super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&(__p_00->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (__p_00->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (__p_00->m_mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    local_30._M_t.
    super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    .
    super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
    ._M_head_impl =
         (tuple<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
          )(_Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
            )0x0;
    std::
    __uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::reset((__uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             *)&this->asyncCallInfo,__p_00);
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::~unique_ptr((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                   *)&local_30);
    bVar6 = this->singleThreadFederate;
  }
  coreObj = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (ConnectorFederateManager *)operator_new(0x1c8);
  ConnectorFederateManager::ConnectorFederateManager
            (this_00,coreObj,this,(LocalFederateId)(this->fedID).fid,(bool)(bVar6 & 1));
  local_30._M_t.
  super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  .
  super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
  ._M_head_impl =
       (tuple<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
        )(_Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::reset((__uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
           *)&this->cManager,this_00);
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::~unique_ptr((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                 *)&local_30);
  if ((this->configFile)._M_string_length != 0) {
    registerConnectorInterfaces(this,&this->configFile);
  }
  return;
}

Assistant:

void Federate::registerFederate(const FederateInfo& fedInfo)
{
    // this call will throw an error on failure
    fedID = coreObject->registerFederate(mName, fedInfo);
    if (mName.find("${") != std::string::npos) {
        mName = coreObject->getFederateName(fedID);
    }

    nameSegmentSeparator = fedInfo.separator;
    strictConfigChecking = fedInfo.checkFlagProperty(defs::Flags::STRICT_CONFIG_CHECKING, true);

    useJsonSerialization = fedInfo.useJsonSerialization;
    observerMode = fedInfo.observer;
    configFile = fedInfo.configString;
    mCurrentTime = coreObject->getCurrentTime(fedID);
    if (!singleThreadFederate) {
        asyncCallInfo = std::make_unique<shared_guarded_m<AsyncFedCallInfo>>();
    }
    cManager = std::make_unique<ConnectorFederateManager>(coreObject.get(),
                                                          this,
                                                          fedID,
                                                          singleThreadFederate);
    if (!configFile.empty()) {
        registerConnectorInterfaces(configFile);
    }
}